

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O3

int64_t __thiscall cali::StringConverter::to_int64(StringConverter *this,bool *okptr)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  int64_t iVar3;
  undefined8 uVar4;
  bool bVar5;
  char *local_30;
  
  __nptr = (this->m_str)._M_dataplus._M_p;
  piVar2 = __errno_location();
  iVar1 = *piVar2;
  *piVar2 = 0;
  iVar3 = strtoll(__nptr,&local_30,10);
  if (local_30 == __nptr) {
    uVar4 = std::__throw_invalid_argument("stoll");
    if (*piVar2 == 0) {
      *piVar2 = iVar1;
    }
    __cxa_begin_catch(uVar4);
    __cxa_end_catch();
    iVar3 = 0;
    bVar5 = false;
    goto LAB_0018f6ea;
  }
  if (*piVar2 == 0) {
LAB_0018f6e5:
    *piVar2 = iVar1;
  }
  else if (*piVar2 == 0x22) {
    iVar3 = std::__throw_out_of_range("stoll");
    goto LAB_0018f6e5;
  }
  bVar5 = true;
LAB_0018f6ea:
  if (okptr != (bool *)0x0) {
    *okptr = bVar5;
  }
  return iVar3;
}

Assistant:

int64_t cali::StringConverter::to_int64(bool* okptr) const
{
    bool    ok  = false;
    int64_t res = 0;

    try {
        res = std::stoll(m_str);
        ok  = true;
    } catch (...) {
        ok = false;
    }

    if (okptr)
        *okptr = ok;

    return res;
}